

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# islamcal.cpp
# Opt level: O1

void __thiscall
icu_63::IslamicCalendar::setCalculationType
          (IslamicCalendar *this,ECalculationType type,UErrorCode *status)

{
  double millis;
  
  if (*(ECalculationType *)&(this->super_Calendar).field_0x264 == type) {
    return;
  }
  millis = Calendar::getTimeInMillis(&this->super_Calendar,status);
  *(ECalculationType *)&(this->super_Calendar).field_0x264 = type;
  Calendar::clear(&this->super_Calendar);
  Calendar::setTimeInMillis(&this->super_Calendar,millis,status);
  return;
}

Assistant:

void IslamicCalendar::setCalculationType(ECalculationType type, UErrorCode &status)
{
    if (cType != type) {
        // The fields of the calendar will become invalid, because the calendar
        // rules are different
        UDate m = getTimeInMillis(status);
        cType = type;
        clear();
        setTimeInMillis(m, status);
    }
}